

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::InputScalarAsWidgetReplacement
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *data_ptr,
               char *format)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *window_00;
  char *format_00;
  iterator initial_value_buf;
  ImVec2 local_a8;
  byte local_9d;
  ImGuiInputTextFlags local_9c;
  char local_98 [3];
  bool value_changed;
  ImGuiInputTextFlags flags;
  char data_buf [32];
  char fmt_buf [32];
  ImGuiWindow *window;
  ImGuiContext *g;
  char *format_local;
  void *data_ptr_local;
  ImGuiDataType data_type_local;
  char *label_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar1 = GImGui;
  window_00 = GetCurrentWindow();
  SetActiveID(pIVar1->ScalarAsInputTextId,window_00);
  pIVar1->ActiveIdAllowNavDirFlags = 0xc;
  SetHoveredID(0);
  FocusableItemUnregister(window_00);
  format_00 = ParseFormatTrimDecorations(format,data_buf + 0x18,0x20);
  DataTypeFormatString(local_98,0x20,data_type,data_ptr,format_00);
  local_9c = 0x11;
  if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) {
    local_9c = 0x20010;
  }
  local_a8 = ImRect::GetSize(bb);
  local_9d = InputTextEx(label,local_98,0x20,&local_a8,local_9c,(ImGuiTextEditCallback)0x0,
                         (void *)0x0);
  if (pIVar1->ScalarAsInputTextId == 0) {
    if (pIVar1->ActiveId != id) {
      __assert_fail("g.ActiveId == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0x2199,
                    "bool ImGui::InputScalarAsWidgetReplacement(const ImRect &, ImGuiID, const char *, ImGuiDataType, void *, const char *)"
                   );
    }
    pIVar1->ScalarAsInputTextId = pIVar1->ActiveId;
    SetHoveredID(id);
  }
  if ((local_9d & 1) == 0) {
    bb_local._7_1_ = false;
  }
  else {
    initial_value_buf = ImVector<char>::begin(&(pIVar1->InputTextState).InitialText);
    bb_local._7_1_ =
         DataTypeApplyOpFromText(local_98,initial_value_buf,data_type,data_ptr,(char *)0x0);
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::InputScalarAsWidgetReplacement(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* data_ptr, const char* format)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Our replacement widget will override the focus ID (registered previously to allow for a TAB focus to happen)
    // On the first frame, g.ScalarAsInputTextId == 0, then on subsequent frames it becomes == id
    SetActiveID(g.ScalarAsInputTextId, window);
    g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
    SetHoveredID(0);
    FocusableItemUnregister(window);

    char fmt_buf[32];
    char data_buf[32];
    format = ParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, data_ptr, format);
    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ((data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImGuiInputTextFlags_CharsScientific : ImGuiInputTextFlags_CharsDecimal);
    bool value_changed = InputTextEx(label, data_buf, IM_ARRAYSIZE(data_buf), bb.GetSize(), flags);
    if (g.ScalarAsInputTextId == 0)     // First frame we started displaying the InputText widget
    {
        IM_ASSERT(g.ActiveId == id);    // InputText ID expected to match the Slider ID
        g.ScalarAsInputTextId = g.ActiveId;
        SetHoveredID(id);
    }
    if (value_changed)
        return DataTypeApplyOpFromText(data_buf, g.InputTextState.InitialText.begin(), data_type, data_ptr, NULL);
    return false;
}